

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__fancy_alpha_unweight_2ch(float *encode_buffer,int width_times_channels)

{
  float fVar1;
  float alpha;
  float *end_output;
  float *input;
  float *encode;
  int width_times_channels_local;
  float *encode_buffer_local;
  
  end_output = encode_buffer;
  input = encode_buffer;
  do {
    fVar1 = end_output[1];
    *input = *end_output;
    if (7.523164e-37 <= fVar1) {
      *input = end_output[2] / fVar1;
    }
    input[1] = fVar1;
    end_output = end_output + 3;
    input = input + 2;
  } while (input < encode_buffer + width_times_channels);
  return;
}

Assistant:

static void stbir__fancy_alpha_unweight_2ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float STBIR_SIMD_STREAMOUT_PTR(*) input = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  do {
    float alpha = input[1];
    encode[0] = input[0];
    if ( alpha >= stbir__small_float )
      encode[0] = input[2] / alpha;
    encode[1] = alpha;

    input += 3;
    encode += 2;
  } while ( encode < end_output );
}